

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound
          (LayoutTests *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  void *pvVar2;
  wrap limiter;
  long lVar3;
  uint *puVar4;
  factory_ptr f;
  layout l;
  char_to_index indices [2];
  int local_3d0 [6];
  undefined1 local_3b8 [4];
  float fStack_3b4;
  float local_3b0;
  undefined4 uStack_3ac;
  undefined1 local_3a8 [16];
  iterator local_398;
  positioned_glyph *ppStack_390;
  bool local_388;
  font_factory *local_380;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_378;
  vector<int,_std::allocator<int>_> local_370;
  vector<int,_std::allocator<int>_> local_358;
  vector<int,_std::allocator<int>_> local_340;
  vector<int,_std::allocator<int>_> local_328;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  undefined1 local_2e0 [4];
  float fStack_2dc;
  float fStack_2d8;
  undefined1 local_2d0 [24];
  vector<int,_std::allocator<int>_> local_2b8;
  vector<int,_std::allocator<int>_> local_298;
  vector<int,_std::allocator<int>_> local_278;
  vector<int,_std::allocator<int>_> local_260;
  int local_248 [2];
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_240;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  uint uStack_214;
  undefined1 local_210 [32];
  undefined1 local_1f0 [24];
  _Alloc_hider local_1d8;
  char local_1c8 [32];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_1a8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_190;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_178;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_160;
  string local_148;
  layout local_128;
  ref_text_line local_d8;
  ref_text_line local_b0;
  glyph local_88;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_88.metrics.dx = 2.12199582307954e-314;
  local_88.metrics.dy = 1.58101006669199e-322;
  local_88.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  local_88.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x4014000000000000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)&local_380,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,(glyph (*) [2])&local_88);
  local_128._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_128._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_128._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._glyphs._limit = (positioned_glyph *)0x0;
  local_128._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._glyphs._begin = (positioned_glyph *)0x0;
  local_128._glyphs._end = (positioned_glyph *)0x0;
  local_128._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"AAAAA   A   A","");
  R((richtext_t *)local_210,(string *)local_3b8);
  local_228 = 0x41d00000;
  uStack_224 = 0;
  uStack_220 = 0;
  uStack_21c = 0;
  uStack_218 = 0;
  uStack_214 = uStack_214 & 0xffffff00;
  lVar3 = (ulong)uStack_214 << 0x20;
  limiter._sow.next = (int)lVar3;
  limiter._previous_space = (bool)(char)((ulong)lVar3 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar3 >> 0x28);
  limiter._limit = 26.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&local_128,(richtext_t *)local_210,limiter,local_380);
  if (local_1d8._M_p != local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector((vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
             *)local_1f0);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_);
  }
  if (_local_3b8 != local_3a8) {
    operator_delete(_local_3b8);
  }
  peVar1 = (local_380->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (local_380->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_248[1] = 1;
  local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_298,
             (iterator)
             local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_248 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&local_328,&local_298);
  local_3d0[5] = 1;
  if (local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_328,
               (iterator)
               local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0 + 5);
  }
  else {
    *local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_310,&local_328);
  local_3d0[4] = 1;
  if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_310,
               (iterator)
               local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0 + 4);
  }
  else {
    *local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2f8,&local_310);
  local_3d0[3] = 1;
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_2f8,
               (iterator)
               local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0 + 3);
  }
  else {
    *local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_260,&local_2f8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1f0._0_8_ = (pointer)0x0;
  local_1f0._8_8_ = (pointer)0x0;
  local_210._16_8_ = 0;
  local_210._24_8_ = (void *)0x0;
  local_1f0[0x10] = false;
  local_210._0_8_ = peVar1;
  local_210._8_8_ = this_00;
  if (local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar4 = (uint *)local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_3b8 = (undefined1  [4])*puVar4;
      fStack_3b4 = 0.0;
      local_3b0 = 0.0;
      if (local_1f0._0_8_ == local_1f0._8_8_) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_210 + 0x18),(iterator)local_1f0._0_8_,(positioned_glyph *)local_3b8);
      }
      else {
        ((vector_r *)(local_1f0._0_8_ + 4))->dy = 0.0;
        *(ulong *)local_1f0._0_8_ = (ulong)(uint)local_3b8;
        local_1f0._0_8_ = local_1f0._0_8_ + 0xc;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_178,1,(value_type *)local_210,(allocator_type *)local_3b8);
  ref_text_line::ref_text_line(&local_b0,0.0,10.0,0.0,&local_178);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_240,1,&local_b0,(allocator_type *)local_3b8);
  peVar1 = (local_380->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (local_380->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)operator_new(4);
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start + 1;
  *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = 1;
  local_248[0] = 0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&local_2b8,
             (iterator)
             local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,local_248);
  std::vector<int,_std::allocator<int>_>::vector(&local_370,&local_2b8);
  local_3d0[2] = 0;
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_370,
               (iterator)
               local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0 + 2);
  }
  else {
    *local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_358,&local_370);
  local_3d0[1] = 0;
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_358,
               (iterator)
               local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0 + 1);
  }
  else {
    *local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_340,&local_358);
  local_3d0[0] = 1;
  if (local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_340,
               (iterator)
               local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_3d0);
  }
  else {
    *local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_278,&local_340);
  local_3b8 = SUB84(peVar1,0);
  fStack_3b4 = (float)((ulong)peVar1 >> 0x20);
  local_3b0 = SUB84(this_01,0);
  uStack_3ac = (undefined4)((ulong)this_01 >> 0x20);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_398._M_current = (positioned_glyph *)0x0;
  ppStack_390 = (positioned_glyph *)0x0;
  local_3a8._0_8_ = 0;
  local_3a8._8_8_ = (void *)0x0;
  local_388 = false;
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    puVar4 = (uint *)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      local_2e0 = (undefined1  [4])*puVar4;
      fStack_2dc = 0.0;
      fStack_2d8 = 0.0;
      if (local_398._M_current == ppStack_390) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                   (local_3a8 + 8),local_398,(positioned_glyph *)local_2e0);
      }
      else {
        ((local_398._M_current)->d).dy = 0.0;
        (local_398._M_current)->index = (int)(ulong)(uint)local_2e0;
        ((local_398._M_current)->d).dx = (float)(int)((ulong)(uint)local_2e0 >> 0x20);
        local_398._M_current = local_398._M_current + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != (uint *)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_190,1,(value_type *)local_3b8,(allocator_type *)local_2e0);
  ref_text_line::ref_text_line(&local_d8,0.0,24.0,0.0,&local_190);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_240,&local_d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_160,&local_240);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_1a8,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_128._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_128._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_2e0);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_2e0,&local_148,0x216);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_160,&local_1a8,(LocationInfo *)local_2e0);
  if ((undefined1 *)CONCAT44(fStack_2dc,local_2e0) != local_2d0) {
    operator_delete((undefined1 *)CONCAT44(fStack_2dc,local_2e0));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_1a8.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_160);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_d8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_190);
  if ((void *)local_3a8._8_8_ != (void *)0x0) {
    operator_delete((void *)local_3a8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3ac,local_3b0) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3ac,local_3b0));
  }
  if ((uint *)local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_240);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_b0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_178);
  if ((void *)local_210._24_8_ != (void *)0x0) {
    operator_delete((void *)local_210._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
  }
  if ((uint *)local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_260.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_298.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_128._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_128._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_128._glyph_runs);
  if (local_128._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_128._glyphs._begin);
  }
  if (local_378 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_378);
  }
  lVar3 = 0x38;
  do {
    pvVar2 = *(void **)((long)&local_88.outline.
                               super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsNotFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 1 }, { L' ', 0 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 4, 0 } },
					{ { 5, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   A   A"), limit::wrap(26.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 1 + 1 + 1 + 1))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 0 + 0 + 0 + 1)),
					mkvector(l.begin(), l.end()));
			}